

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::process_single_dash<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,string *arg_name,string *program_name,
          basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  option **ppoVar5;
  long lVar6;
  byte local_109;
  bool local_e9;
  maybe<pstore::command_line::option_*,_void> local_e8;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_d8;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  maybe<pstore::command_line::option_*,_void> local_60 [2];
  char local_3b [2];
  sticky_bool<false> local_39;
  undefined1 local_38 [5];
  char name [2];
  sticky_bool<false> ok;
  maybe<pstore::command_line::option_*,_void> handler;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  string *program_name_local;
  string *arg_name_local;
  
  bVar1 = starts_with((string *)this,"-");
  if (!bVar1) {
    assert_failed("starts_with (arg_name, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                  ,0xc5);
  }
  std::__cxx11::string::erase((ulong)this,0);
  nothing<pstore::command_line::option*>();
  sticky_bool<false>::sticky_bool(&local_39,true);
  while( true ) {
    bVar1 = sticky_bool::operator_cast_to_bool((sticky_bool *)&local_39);
    local_109 = 0;
    if (bVar1) {
      local_109 = std::__cxx11::string::empty();
      local_109 = local_109 ^ 0xff;
    }
    if ((local_109 & 1) == 0) goto LAB_001143b8;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
    local_3b[0] = *pcVar4;
    local_3b[1] = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,local_3b,&local_81);
    find_handler(local_60,(string *)local_80);
    maybe<pstore::command_line::option_*,_void>::operator=
              ((maybe<pstore::command_line::option_*,_void> *)local_38,local_60);
    maybe<pstore::command_line::option_*,_void>::~maybe(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    bVar1 = maybe::operator_cast_to_bool((maybe *)local_38);
    if (!bVar1) break;
    ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)local_38);
    uVar2 = (*(*ppoVar5)->_vptr_option[9])();
    if ((uVar2 & 1) != 0) break;
    ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)local_38);
    uVar2 = (*(*ppoVar5)->_vptr_option[0xe])();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::erase((ulong)this,0);
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator*
                          ((maybe<pstore::command_line::option_*,_void> *)local_38);
      iVar3 = (*(*ppoVar5)->_vptr_option[0x10])();
      sticky_bool<false>::operator=(&local_39,(bool)((byte)iVar3 & 1));
    }
    else {
      std::__cxx11::string::erase((ulong)this,0);
      lVar6 = std::__cxx11::string::length();
      if (lVar6 == 0) goto LAB_001143b8;
      maybe<pstore::command_line::option_*,_void>::maybe
                (&local_e8,(maybe<pstore::command_line::option_*,_void> *)local_38);
      bVar1 = handler_set_value(&local_e8,(string *)this);
      sticky_bool<false>::operator=(&local_39,bVar1);
      maybe<pstore::command_line::option_*,_void>::~maybe(&local_e8);
      std::__cxx11::string::clear();
    }
    maybe<pstore::command_line::option_*,_void>::reset
              ((maybe<pstore::command_line::option_*,_void> *)local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,local_3b,&local_a9);
  nothing<std::__cxx11::string>();
  report_unknown_option<std::ostream>
            (arg_name,(string *)local_a8,&local_d8,
             (basic_ostream<char,_std::char_traits<char>_> *)program_name);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  ~maybe(&local_d8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  sticky_bool<false>::operator=(&local_39,false);
LAB_001143b8:
  local_e9 = sticky_bool<false>::get(&local_39);
  std::make_tuple<pstore::maybe<pstore::command_line::option*,void>,bool>
            (__return_storage_ptr__,(maybe<pstore::command_line::option_*,_void> *)local_38,
             &local_e9);
  maybe<pstore::command_line::option_*,_void>::~maybe
            ((maybe<pstore::command_line::option_*,_void> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<maybe<option *>, bool> process_single_dash (std::string arg_name,
                                                                   std::string const & program_name,
                                                                   ErrorStream & errs) {
                PSTORE_ASSERT (starts_with (arg_name, "-"));
                arg_name.erase (0, 1U); // Remove the leading dash.

                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};
                while (ok && !arg_name.empty ()) {
                    char const name[2]{arg_name[0], '\0'};
                    handler = find_handler (name);
                    if (!handler || (*handler)->is_positional ()) {
                        report_unknown_option (program_name, name, nothing<std::string> (), errs);
                        ok = false;
                        break;
                    }

                    if ((*handler)->takes_argument ()) {
                        arg_name.erase (0, 1U);
                        if (arg_name.length () == 0U) {
                            // No value was supplied immediately after the argument name. It
                            // could be the next argument.
                            break;
                        }
                        ok = handler_set_value (handler, arg_name);
                        arg_name.clear ();
                    } else {
                        arg_name.erase (0, 1U);
                        ok = (*handler)->add_occurrence ();
                    }
                    handler.reset ();
                }
                return std::make_tuple (std::move (handler), ok.get ());
            }